

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_suite::random_access_iterator_addition(void)

{
  view_pointer pcVar1;
  initializer_list<int> __l;
  iterator_type iVar2;
  iterator iVar3;
  undefined4 local_74;
  iterator local_70;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&local_70);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  local_70 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+
                    (&local_70,2);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  pcVar1 = (view_pointer)
           std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                     (iVar3.parent,iVar3.current,iVar2.parent,iVar2.current);
  local_70.parent = pcVar1;
  local_74 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xbb,"void concept_suite::random_access_iterator_addition()",&local_70,&local_74);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+
                    (&local_70,2);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  pcVar1 = (view_pointer)
           std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                     (iVar3.parent,iVar3.current,iVar2.parent,iVar2.current);
  local_70.parent = pcVar1;
  local_74 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), b)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xbe,"void concept_suite::random_access_iterator_addition()",&local_70,&local_74);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void random_access_iterator_addition()
{
    // a + n
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin() + 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
    // n + a
    circular_view<int>::iterator b = 2 + span.begin();
    BOOST_TEST_EQ(std::distance(span.begin(), b), 2);
}